

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O0

int Vec_IntPushUniqueOrderCost(Vec_Int_t *p,int Entry,Vec_Int_t *vCost)

{
  int local_2c;
  int i;
  Vec_Int_t *vCost_local;
  int Entry_local;
  Vec_Int_t *p_local;
  
  local_2c = 0;
  while( true ) {
    if (p->nSize <= local_2c) {
      Vec_IntPushOrderCost(p,Entry,vCost);
      return 0;
    }
    if (p->pArray[local_2c] == Entry) break;
    local_2c = local_2c + 1;
  }
  return 1;
}

Assistant:

static inline int Vec_IntPushUniqueOrderCost( Vec_Int_t * p, int Entry, Vec_Int_t * vCost )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_IntPushOrderCost( p, Entry, vCost );
    return 0;
}